

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManAddClauses(Gla_Man_t *p,int iObj,int iFrame,Vec_Int_t *vLits)

{
  sat_solver2 *s;
  int iVar3;
  int iVar4;
  int iVar5;
  int c;
  lit Entry;
  Gla_Obj_t *pGVar6;
  int *begin;
  int *piVar7;
  lit *local_50;
  int *pLit;
  int iFirstClause;
  int nClauses;
  int RetValue;
  int i;
  int iVar2;
  int iVar1;
  int iVar;
  Gla_Obj_t *pGlaObj;
  Vec_Int_t *vLits_local;
  int iFrame_local;
  int iObj_local;
  Gla_Man_t *p_local;
  
  pGVar6 = Gla_ManObj(p,iObj);
  if ((*(uint *)&pGVar6->field_0x4 >> 2 & 1) == 0) {
    if ((*(uint *)&pGVar6->field_0x4 >> 5 & 1) == 0) {
      if ((*(uint *)&pGVar6->field_0x4 >> 7 & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGlaOld.c"
                      ,0x54f,"void Gla_ManAddClauses(Gla_Man_t *, int, int, Vec_Int_t *)");
      }
      iVar3 = p->pCnf->pObj2Count[pGVar6->iGiaObj];
      iVar4 = p->pCnf->pObj2Clause[pGVar6->iGiaObj];
      for (nClauses = iVar4; nClauses < iVar4 + iVar3; nClauses = nClauses + 1) {
        Vec_IntClear(vLits);
        for (local_50 = p->pCnf->pClauses[nClauses]; local_50 < p->pCnf->pClauses[nClauses + 1];
            local_50 = local_50 + 1) {
          iVar5 = lit_var(*local_50);
          iVar5 = Gla_ManGetVar(p,iVar5,iFrame);
          c = lit_sign(*local_50);
          Entry = toLitCond(iVar5,c);
          Vec_IntPush(vLits,Entry);
        }
        s = p->pSat;
        begin = Vec_IntArray(vLits);
        piVar7 = Vec_IntArray(vLits);
        iVar5 = Vec_IntSize(vLits);
        sat_solver2_addclause(s,begin,piVar7 + iVar5,iObj);
      }
    }
    else {
      if (*(uint *)&pGVar6->field_0x4 >> 9 != 1) {
        __assert_fail("pGlaObj->nFanins == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGlaOld.c"
                      ,0x532,"void Gla_ManAddClauses(Gla_Man_t *, int, int, Vec_Int_t *)");
      }
      if (iFrame == 0) {
        iVar3 = Gla_ManGetVar(p,iObj,0);
        sat_solver2_add_const(p->pSat,iVar3,1,0,iObj);
      }
      else {
        iVar3 = Gla_ManGetVar(p,iObj,iFrame);
        iVar4 = Gla_ManGetVar(p,pGVar6->Fanins[0],iFrame + -1);
        sat_solver2_add_buffer(p->pSat,iVar3,iVar4,*(uint *)&pGVar6->field_0x4 >> 1 & 1,0,iObj);
      }
    }
  }
  else {
    iVar3 = Gla_ManGetVar(p,iObj,iFrame);
    sat_solver2_add_const(p->pSat,iVar3,1,0,iObj);
  }
  return;
}

Assistant:

void Gla_ManAddClauses( Gla_Man_t * p, int iObj, int iFrame, Vec_Int_t * vLits )
{
    Gla_Obj_t * pGlaObj = Gla_ManObj( p, iObj );
    int iVar, iVar1, iVar2;
    if ( pGlaObj->fConst )
    {
        iVar = Gla_ManGetVar( p, iObj, iFrame );
        sat_solver2_add_const( p->pSat, iVar, 1, 0, iObj );
    }
    else if ( pGlaObj->fRo )
    {
        assert( pGlaObj->nFanins == 1 );
        if ( iFrame == 0 )
        {
            iVar = Gla_ManGetVar( p, iObj, iFrame );
            sat_solver2_add_const( p->pSat, iVar, 1, 0, iObj );
        }
        else
        {
            iVar1 = Gla_ManGetVar( p, iObj, iFrame );
            iVar2 = Gla_ManGetVar( p, pGlaObj->Fanins[0], iFrame-1 );
            sat_solver2_add_buffer( p->pSat, iVar1, iVar2, pGlaObj->fCompl0, 0, iObj );
        }
    }
    else if ( pGlaObj->fAnd )
    {
        int i, RetValue, nClauses, iFirstClause, * pLit;
        nClauses = p->pCnf->pObj2Count[pGlaObj->iGiaObj];
        iFirstClause = p->pCnf->pObj2Clause[pGlaObj->iGiaObj];
        for ( i = iFirstClause; i < iFirstClause + nClauses; i++ )
        {
            Vec_IntClear( vLits );
            for ( pLit = p->pCnf->pClauses[i]; pLit < p->pCnf->pClauses[i+1]; pLit++ )
            {
                iVar = Gla_ManGetVar( p, lit_var(*pLit), iFrame );
                Vec_IntPush( vLits, toLitCond( iVar, lit_sign(*pLit) ) );
            }
            RetValue = sat_solver2_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntArray(vLits)+Vec_IntSize(vLits), iObj );
        }
    }
    else assert( 0 );
}